

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

string * namingConventions::editToNewName
                   (string *__return_storage_ptr__,string *word,string *oldName,string *correctName)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  uint *local_60;
  size_type local_58;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  string *local_40;
  string *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = local_50 & 0xffffff00;
  uVar14 = word->_M_string_length;
  if (uVar14 == 0) {
    uVar6 = 0;
LAB_00106b86:
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)(correctName->_M_dataplus)._M_p);
    while (uVar6 = uVar6 + 1, (ulong)uVar6 < word->_M_string_length) {
      std::__cxx11::string::push_back((char)&local_60);
    }
    paVar4 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
    local_38 = __return_storage_ptr__;
    if (local_60 != &local_50) {
LAB_00106bcd:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT44(uStack_4c,local_50);
      local_38 = __return_storage_ptr__;
      goto LAB_00106be3;
    }
  }
  else {
    uVar8 = 0;
    uVar12 = 0;
    bVar3 = false;
    uVar5 = 0;
    iVar10 = 0;
    uVar7 = 0;
    uVar9 = 0;
    uVar11 = 0;
    do {
      bVar1 = (word->_M_dataplus)._M_p[uVar8];
      uVar6 = (uint)uVar8;
      if (bVar1 != 0x28) {
        uVar6 = uVar5;
      }
      uVar5 = uVar6;
      if ((bVar1 != (oldName->_M_dataplus)._M_p[uVar12]) || (bVar3)) {
        if ((bVar1 & 0xfe) != 0x28) {
          iVar10 = iVar10 + (uint)(bVar1 != 0x3b);
        }
        uVar11 = 0;
        bVar3 = false;
        uVar12 = 0;
      }
      else if (oldName->_M_string_length - 1 == (ulong)uVar11) {
        if (uVar11 == 0) {
          uVar9 = uVar8 & 0xffffffff;
        }
        bVar3 = true;
        uVar7 = uVar8 & 0xffffffff;
      }
      else {
        uVar12 = (ulong)((int)uVar12 + 1);
        bVar15 = uVar11 == 0;
        uVar11 = uVar11 + 1;
        if (bVar15) {
          uVar9 = uVar8 & 0xffffffff;
        }
      }
      uVar6 = (uint)uVar7;
      uVar8 = uVar8 + 1;
    } while ((uVar8 & 0xffffffff) < uVar14);
    local_38 = __return_storage_ptr__;
    local_40 = correctName;
    if (iVar10 == 0) {
      if ((int)uVar9 != 0) {
        uVar14 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_60);
          uVar14 = uVar14 + 1;
          correctName = local_40;
          __return_storage_ptr__ = local_38;
        } while (uVar9 != uVar14);
      }
      goto LAB_00106b86;
    }
    if (uVar5 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (word->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar14);
      if (local_60 == &local_50) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60,CONCAT44(uStack_4c,local_50) + 1);
      return __return_storage_ptr__;
    }
    if (bVar3) {
      if (uVar5 != 0xffffffff) {
        lVar13 = 0;
        do {
          std::__cxx11::string::push_back((char)&local_60);
          lVar13 = lVar13 + 1;
        } while ((ulong)uVar5 + 1 != lVar13);
      }
      std::__cxx11::string::_M_append((char *)&local_60,(ulong)(local_40->_M_dataplus)._M_p);
      paVar4 = &local_38->field_2;
      (local_38->_M_dataplus)._M_p = (pointer)paVar4;
      __return_storage_ptr__ = local_38;
      if (local_60 == &local_50) goto LAB_00106be0;
      goto LAB_00106bcd;
    }
    std::__cxx11::string::_M_assign((string *)&local_60);
    if ((ulong)uVar5 < word->_M_string_length) {
      do {
        uVar5 = uVar5 + 1;
        std::__cxx11::string::push_back((char)&local_60);
      } while ((ulong)uVar5 < word->_M_string_length);
    }
    paVar4 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar4;
    local_38 = __return_storage_ptr__;
    if (local_60 != &local_50) goto LAB_00106bcd;
  }
LAB_00106be0:
  *(uint *)paVar4 = local_50;
  *(undefined4 *)((long)paVar4 + 4) = uStack_4c;
  *(undefined4 *)((long)paVar4 + 8) = uStack_48;
  *(undefined4 *)((long)paVar4 + 0xc) = uStack_44;
LAB_00106be3:
  local_38->_M_string_length = local_58;
  return local_38;
}

Assistant:

std::string
namingConventions::editToNewName(std::string &word, const std::string &oldName, const std::string &correctName) {
    unsigned int correctCount = 0;
    unsigned int start = 0;
    unsigned int end = 0;
    unsigned int misses = 0;
    std::string newName;
    unsigned int functionCall = 0;

    bool found = false;
    unsigned int oldname_i = 0;

    // zoekt start en eindpunt van gezochte naam in stukje tekst, telt het aantal misses, etc..
    for (unsigned int c = 0; c < word.size(); ++c) {
      if(word[c] == '('){
        functionCall = c;
      }

        if (word[c] == oldName[oldname_i] && !found) {
            if (correctCount == oldName.size() - 1) {
                end = c;
                found = true;
                if(correctCount == 0){
                  start = c;
                }
            } else {
                correctCount += 1;
                oldname_i += 1;
                if (correctCount == 1) {
                    start = c;
                }
            }

        } else {
            correctCount = 0;
            found = false;
            oldname_i = 0;
            if(word[c] != '(' && word[c] != ')' && word[c] != ';' )
            misses += 1;
        }
    }

    // past de tekst aan
    if(misses > 0){
      if(functionCall != 0 && found){
        unsigned int pos = 0;
        while (pos != functionCall + 1) { //variable in function call
          newName += word[pos];
          pos += 1;
        }
        newName += correctName;
        return newName;

      }else if(functionCall != 0){  // function being called
        newName = correctName;
        while (functionCall < word.size()) {
          newName += word[functionCall];
          functionCall += 1;
        }
        return newName;
      }
      return word;
    }
    unsigned int pos = 0;
    while (pos != start) {
        newName += word[pos];
        pos += 1;
    }
    newName += correctName;
    pos = end + 1;
    while (pos < word.size()) {
        newName += word[pos];
        pos += 1;
    }
    return newName;

}